

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O0

void extractStructureLevel(Classification *result,string *c,size_t *i)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_48 [8];
  string level;
  size_t start;
  size_t *i_local;
  string *c_local;
  Classification *result_local;
  
  level.field_2._8_8_ = *i;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)c);
  if (*pcVar2 == '-') {
    *i = *i + 1;
  }
  do {
    uVar4 = *i;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar4) {
LAB_001da636:
      std::__cxx11::string::substr((ulong)local_48,(ulong)c);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        iVar1 = std::__cxx11::stoi((string *)local_48,(size_t *)0x0,10);
        result->sectionLevel = iVar1 + -1;
      }
      std::__cxx11::string::~string((string *)local_48);
      return;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)c);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 == 0) {
      *i = *i - 1;
      goto LAB_001da636;
    }
    *i = *i + 1;
  } while( true );
}

Assistant:

void extractStructureLevel (Classification &result, string &c, size_t &i) {
    auto start = i;
    if (c[i] == '-') { i++; }
    for (; i < c.size(); i++) {
        if (!isdigit(c[i])) { i--; break; } // i will be incremented after
    }

    string level = c.substr(start, i - start);
    if (level.empty()) { return; }

    result.sectionLevel = std::stoi(level) - 1;
}